

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

void __thiscall
wirehair::PeelRowParameters::Initialize
          (PeelRowParameters *this,uint32_t row_seed,uint32_t p_seed,uint16_t peel_column_count,
          uint16_t mix_column_count)

{
  byte bVar1;
  uint uVar2;
  uint16_t in_CX;
  ulong uVar3;
  uint in_EDX;
  uint in_ESI;
  ushort *in_RDI;
  ushort in_R8W;
  uint32_t rv_mix;
  uint32_t rv_peel;
  uint16_t max_weight;
  uint16_t weight;
  PCGRandom prng;
  uint32_t rot_2;
  uint32_t xorshifted_2;
  uint64_t oldstate_2;
  uint32_t rot_1;
  uint32_t xorshifted_1;
  uint64_t oldstate_1;
  uint32_t rot;
  uint32_t xorshifted;
  uint64_t oldstate;
  ushort local_8a;
  PCGRandom local_70;
  ushort local_5c;
  uint16_t local_5a;
  uint local_58;
  uint local_54;
  uint local_18;
  uint local_14;
  PCGRandom *local_8;
  
  local_5c = in_R8W;
  local_5a = in_CX;
  local_58 = in_EDX;
  local_54 = in_ESI;
  PCGRandom::PCGRandom(&local_70);
  PCGRandom::Seed(&local_70,(ulong)local_54,(ulong)local_58);
  local_8 = &local_70;
  local_14 = (uint)((local_70.State >> 0x12 ^ local_70.State) >> 0x1b);
  local_18 = (uint)(local_70.State >> 0x3b);
  bVar1 = (byte)(local_70.State >> 0x38);
  local_70.State = local_70.State * 0x5851f42d4c957f2d + local_70.Inc;
  local_8a = GeneratePeelRowWeight
                       (local_14 >> (bVar1 >> 3) | local_14 << (-(bVar1 >> 3) & 0x1f),local_5a);
  if (local_5a / 2 < local_8a) {
    local_8a = local_5a / 2;
  }
  *in_RDI = local_8a;
  uVar3 = local_70.State * 0x5851f42d4c957f2d + local_70.Inc;
  uVar2 = (uint)((local_70.State >> 0x12 ^ local_70.State) >> 0x1b);
  bVar1 = (byte)(local_70.State >> 0x38);
  uVar2 = uVar2 >> (bVar1 >> 3) | uVar2 << (-(bVar1 >> 3) & 0x1f);
  in_RDI[2] = (short)((long)(ulong)(uVar2 & 0xffff) % (long)(int)(local_5a - 1)) + 1;
  in_RDI[1] = (ushort)((ulong)(uVar2 >> 0x10) % (ulong)(long)(int)(uint)local_5a);
  uVar2 = (uint)((uVar3 >> 0x12 ^ uVar3) >> 0x1b);
  bVar1 = (byte)(uVar3 >> 0x38);
  uVar2 = uVar2 >> (bVar1 >> 3) | uVar2 << (-(bVar1 >> 3) & 0x1f);
  in_RDI[4] = (short)((long)(ulong)(uVar2 & 0xffff) % (long)(int)(local_5c - 1)) + 1;
  in_RDI[3] = (ushort)((ulong)(uVar2 >> 0x10) % (ulong)(long)(int)(uint)local_5c);
  return;
}

Assistant:

void PeelRowParameters::Initialize(
    uint32_t row_seed,
    uint32_t p_seed,
    uint16_t peel_column_count,
    uint16_t mix_column_count)
{
    // Initialize PRNG
    PCGRandom prng;
    prng.Seed(row_seed, p_seed);

    // Generate peeling matrix row weight
    const uint16_t weight = GeneratePeelRowWeight(prng.Next(), peel_column_count);

    // Do not set more than N/2 at a time
    const uint16_t max_weight = peel_column_count / 2;

    PeelCount = (weight > max_weight) ? max_weight : weight;

    CAT_DEBUG_ASSERT(PeelCount > 0 && PeelCount <= kMaxPeelCount);

    const uint32_t rv_peel = prng.Next();

    // Generate peeling matrix column selection parameters for row
    PeelAdd = ((uint16_t)rv_peel % (peel_column_count - 1)) + 1;
    PeelFirst = (uint16_t)(rv_peel >> 16) % peel_column_count;

    const uint32_t rv_mix = prng.Next();

    // Generate mixing matrix column selection parameters
    MixAdd = ((uint16_t)rv_mix % (mix_column_count - 1)) + 1;
    MixFirst = (uint16_t)(rv_mix >> 16) % mix_column_count;
}